

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# golf.c
# Opt level: O0

void golf_update(float dt)

{
  golf_data_load_state_t gVar1;
  float dt_local;
  
  switch(golf.state) {
  case GOLF_STATE_TITLE_SCREEN:
    golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)(dt + (float)golf.field_1);
    gVar1 = golf_data_get_load_state(golf.level_loading_path);
    if (gVar1 == GOLF_DATA_LOADED) {
      golf.level = golf_data_get_level(golf.level_loading_path);
      golf_goto_main_menu();
    }
    break;
  case GOLF_STATE_MAIN_MENU:
    golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)(dt + (float)golf.field_1);
    break;
  case GOLF_STATE_LOADING_LEVEL:
    golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)(dt + (float)golf.field_1);
    gVar1 = golf_data_get_load_state(golf.level_loading_path);
    if (gVar1 == GOLF_DATA_LOADED) {
      golf.level = golf_data_get_level(golf.level_loading_path);
      golf.state = GOLF_STATE_IN_GAME;
      golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)0x0;
      golf_game_start_level();
    }
    break;
  case GOLF_STATE_IN_GAME:
    golf.field_1 = (anon_union_4_4_5060af42_for_golf_1)(dt + (float)golf.field_1);
  }
  if ((golf.state == GOLF_STATE_MAIN_MENU) || (golf.state == GOLF_STATE_IN_GAME)) {
    golf_game_update(dt);
  }
  golf_ui_update(dt);
  golf_debug_console_update(dt);
  golf_audio_update(dt);
  return;
}

Assistant:

void golf_update(float dt) {
    switch (golf.state) {
        case GOLF_STATE_TITLE_SCREEN: {
            golf.title_screen.t += dt;
            if (golf_data_get_load_state(golf.level_loading_path) == GOLF_DATA_LOADED) {
                golf.level = golf_data_get_level(golf.level_loading_path);
                golf_goto_main_menu(); 
            }
            break;
        }
        case GOLF_STATE_MAIN_MENU: {
            golf.main_menu.t += dt;
            break;
        }
        case GOLF_STATE_LOADING_LEVEL: {
            golf.loading_level.t += dt;
            if (golf_data_get_load_state(golf.level_loading_path) == GOLF_DATA_LOADED) {
                golf.level = golf_data_get_level(golf.level_loading_path);
                golf.state = GOLF_STATE_IN_GAME;
                golf.in_game.t = 0;
                golf_game_start_level();
            }
            break;
        }
        case GOLF_STATE_IN_GAME: {
            golf.in_game.t += dt;
            break;
        }
    }

    if (golf.state == GOLF_STATE_MAIN_MENU || golf.state == GOLF_STATE_IN_GAME) {
        golf_game_update(dt);
    }
    golf_ui_update(dt);
    golf_debug_console_update(dt);
    golf_audio_update(dt);
}